

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# System.c
# Opt level: O1

int kwsysSystem__AppendByte(char *local,char **begin,char **end,int *size,char c)

{
  char *pcVar1;
  char *__dest;
  size_t __n;
  
  pcVar1 = *begin;
  __n = (long)*end - (long)pcVar1;
  if ((long)*size <= (long)__n) {
    __dest = (char *)malloc((long)*size * 2);
    if (__dest == (char *)0x0) {
      return 0;
    }
    memcpy(__dest,pcVar1,__n);
    if (pcVar1 != local) {
      free(pcVar1);
    }
    *begin = __dest;
    *end = __dest + __n;
    *size = *size << 1;
    if (__dest == (char *)0x0) {
      return 0;
    }
  }
  pcVar1 = *end;
  *end = pcVar1 + 1;
  *pcVar1 = c;
  return 1;
}

Assistant:

static int kwsysSystem__AppendByte(const char* local, char** begin, char** end,
                                   int* size, char c)
{
  /* Allocate space for the character.  */
  if ((*end - *begin) >= *size) {
    kwsysSystem_ptrdiff_t length = *end - *begin;
    char* newBuffer = (char*)malloc((size_t)(*size * 2));
    if (!newBuffer) {
      return 0;
    }
    memcpy(newBuffer, *begin, (size_t)(length) * sizeof(char));
    if (*begin != local) {
      free(*begin);
    }
    *begin = newBuffer;
    *end = *begin + length;
    *size *= 2;
  }

  /* Store the character.  */
  *(*end)++ = c;
  return 1;
}